

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int CBS_get_u64_decimal(CBS *cbs,uint64_t *out)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  sVar4 = cbs->len;
  uVar8 = 0;
  bVar2 = 0;
  iVar6 = 0;
  while (sVar4 != 0) {
    bVar1 = *cbs->data;
    iVar3 = OPENSSL_isdigit((uint)bVar1);
    if (iVar3 == 0) break;
    if (cbs->len == 0) {
      sVar4 = 0;
    }
    else {
      cbs->data = cbs->data + 1;
      sVar4 = cbs->len - 1;
      cbs->len = sVar4;
    }
    if (0x1999999999999999 < uVar8) {
      return 0;
    }
    if ((bool)(uVar8 == 0 & bVar2)) {
      return 0;
    }
    uVar5 = uVar8 * 10;
    uVar7 = (ulong)bVar1 - 0x30;
    bVar2 = 1;
    iVar6 = 1;
    uVar8 = uVar7 + uVar5;
    if (CARRY8(uVar7,uVar5)) {
      return 0;
    }
  }
  *out = uVar8;
  return iVar6;
}

Assistant:

int CBS_get_u64_decimal(CBS *cbs, uint64_t *out) {
  uint64_t v = 0;
  int seen_digit = 0;
  while (CBS_len(cbs) != 0) {
    uint8_t c = CBS_data(cbs)[0];
    if (!OPENSSL_isdigit(c)) {
      break;
    }
    CBS_skip(cbs, 1);
    if (/* Forbid stray leading zeros */
        (v == 0 && seen_digit) ||
        // Check for overflow.
        v > UINT64_MAX / 10 ||  //
        v * 10 > UINT64_MAX - (c - '0')) {
      return 0;
    }
    v = v * 10 + (c - '0');
    seen_digit = 1;
  }

  *out = v;
  return seen_digit;
}